

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

bool __thiscall
CUI::DoEditBox(CUI *this,CLineInput *pLineInput,CUIRect *pRect,float FontSize,int Corners,
              IButtonColorFunction *pColorFunction)

{
  bool bVar1;
  long lVar2;
  CLineInput *pCVar3;
  ITextRender *pIVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  char *str;
  byte bVar9;
  int iVar10;
  long in_FS_OFFSET;
  float fVar11;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  anon_union_4_2_94730017_for_vector4_base<float>_7 extraout_XMM0_Db;
  anon_union_4_2_94730017_for_vector4_base<float>_7 extraout_XMM0_Db_00;
  anon_union_4_2_94730039_for_vector4_base<float>_5 in_XMM1_Da;
  anon_union_4_2_94730039_for_vector4_base<float>_5 aVar12;
  anon_union_4_2_94730017_for_vector4_base<float>_7 in_XMM1_Db;
  float fVar13;
  anon_union_4_2_94730039_for_vector4_base<float>_5 aVar14;
  uint local_8c;
  vec4 local_58;
  CUIRect Textbox;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (pLineInput->m_TextCursor).m_FontSize = FontSize;
  (pLineInput->m_TextCursor).m_Align = 4;
  bVar5 = MouseHovered(this,pRect);
  pCVar3 = (CLineInput *)this->m_pLastActiveItem;
  bVar1 = pLineInput->m_WasChanged;
  pLineInput->m_WasChanged = false;
  str = CLineInput::GetDisplayedString(pLineInput);
  aVar14 = (anon_union_4_2_94730039_for_vector4_base<float>_5)pLineInput->m_ScrollOffset;
  CUIRect::VMargin(pRect,2.0,&Textbox);
  if (pCVar3 == pLineInput) {
    local_8c = pLineInput->m_CursorPos;
    if (((bVar5) && ((this->m_MouseButtons & 1) != 0)) && (bVar1 == false)) {
      DoEditBox(CLineInput*,CUIRect_const*,float,int,IButtonColorFunction_const*)::s_DoScroll =
           '\x01';
      DoEditBox::s_ScrollStartX = this->m_MouseX;
      fVar11 = DoEditBox::s_ScrollStartX - Textbox.x;
      iVar7 = pLineInput->m_NumChars;
      fVar13 = 0.0;
      uVar8 = 0;
      for (iVar10 = 1; iVar10 <= iVar7; iVar10 = iVar10 + 1) {
        uVar6 = str_utf8_forward(str,uVar8);
        (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
                  (FontSize,this->m_pTextRender,str,(ulong)uVar6);
        in_XMM1_Da.z = ((extraout_XMM0_Da - fVar13) * 0.5 + fVar13) - aVar14.z;
        in_XMM1_Db = extraout_XMM0_Db;
        if (fVar11 < in_XMM1_Da.z) {
          local_8c = uVar8;
          if (DoEditBox::s_SelectionStartOffset < 0) {
            bVar9 = 0;
            DoEditBox::s_SelectionStartOffset = uVar8;
            goto LAB_0017eb7c;
          }
          bVar9 = 0;
          goto LAB_0017eb86;
        }
        iVar7 = pLineInput->m_NumChars;
        if ((iVar10 == iVar7) &&
           (local_8c = pLineInput->m_Len, DoEditBox::s_SelectionStartOffset < 0)) {
          DoEditBox::s_SelectionStartOffset = local_8c;
        }
        fVar13 = extraout_XMM0_Da;
        uVar8 = uVar6;
      }
      bVar9 = 0;
    }
    else {
      if ((byte)((byte)this->m_MouseButtons & (bVar1 ^ 1U)) == 0) {
        DoEditBox(CLineInput*,CUIRect_const*,float,int,IButtonColorFunction_const*)::s_DoScroll =
             '\0';
        DoEditBox::s_SelectionStartOffset = -1;
        goto LAB_0017e96e;
      }
      if (DoEditBox(CLineInput*,CUIRect_const*,float,int,IButtonColorFunction_const*)::s_DoScroll ==
          '\x01') {
        fVar13 = this->m_MouseX;
        in_XMM1_Db.w = 0.0;
        if ((Textbox.x <= fVar13) || (DoEditBox::s_ScrollStartX - fVar13 <= 10.0)) {
          in_XMM1_Da.z = Textbox.x + Textbox.w;
          if ((fVar13 <= in_XMM1_Da.z) || (fVar13 - DoEditBox::s_ScrollStartX <= 10.0))
          goto LAB_0017eb6e;
          local_8c = str_utf8_forward(str,local_8c);
        }
        else {
          in_XMM1_Da.z = Textbox.x;
          local_8c = str_utf8_rewind(str,local_8c);
        }
        DoEditBox::s_ScrollStartX = this->m_MouseX;
        bVar9 = 1;
      }
      else {
        if (!bVar5) {
          DoEditBox(CLineInput*,CUIRect_const*,float,int,IButtonColorFunction_const*)::s_DoScroll =
               '\0';
          DoEditBox::s_SelectionStartOffset = -1;
          this->m_ActiveItemValid = true;
          this->m_pActiveItem = (void *)0x0;
          this->m_pLastActiveItem = (void *)0x0;
        }
LAB_0017eb6e:
        bVar9 = 0;
      }
    }
LAB_0017eb7c:
    if (-1 < DoEditBox::s_SelectionStartOffset) {
LAB_0017eb86:
      iVar7 = CLineInput::OffsetFromDisplayToActual(pLineInput,local_8c);
      CLineInput::SetCursorOffset(pLineInput,iVar7);
      iVar7 = CLineInput::OffsetFromDisplayToActual(pLineInput,DoEditBox::s_SelectionStartOffset);
      iVar10 = CLineInput::OffsetFromDisplayToActual(pLineInput,local_8c);
      CLineInput::SetSelection(pLineInput,iVar7,iVar10);
    }
  }
  else {
LAB_0017e96e:
    bVar9 = 0;
  }
  if ((CLineInput *)this->m_pActiveItem == pLineInput) {
    this->m_ActiveItemValid = true;
    if ((this->m_MouseButtons & 1) == 0) {
      DoEditBox::s_SelectionStartOffset = -1;
      DoEditBox(CLineInput*,CUIRect_const*,float,int,IButtonColorFunction_const*)::s_DoScroll = '\0'
      ;
      this->m_pActiveItem = (void *)0x0;
    }
  }
  else if (((CLineInput *)this->m_pHotItem == pLineInput) && ((this->m_MouseButtons & 1) != 0)) {
    this->m_ActiveItemValid = true;
    this->m_pActiveItem = pLineInput;
    if (pLineInput != (CLineInput *)0x0) {
      this->m_pLastActiveItem = pLineInput;
    }
  }
  if (bVar5) {
    this->m_pBecommingHotItem = pLineInput;
  }
  if ((bVar9 | bVar1) == 1 && pCVar3 == pLineInput) {
    pIVar4 = this->m_pTextRender;
    uVar8 = CLineInput::OffsetFromActualToDisplay(pLineInput,pLineInput->m_CursorPos);
    (*(pIVar4->super_IInterface)._vptr_IInterface[6])(FontSize,pIVar4,str,(ulong)uVar8);
    in_XMM1_Da.z = extraout_XMM0_Da_00 - aVar14.z;
    if (in_XMM1_Da.z <= Textbox.w) {
      in_XMM1_Db = extraout_XMM0_Db_00;
      if (in_XMM1_Da.z < 0.0) {
        do {
          aVar12.z = aVar14.z - Textbox.w / 3.0;
          aVar14.z = 0.0;
          if (0.0 <= aVar12.z) {
            aVar14.z = aVar12.z;
          }
          in_XMM1_Db.w = 0.0;
          in_XMM1_Da = aVar14;
        } while (extraout_XMM0_Da_00 < aVar14.z);
      }
    }
    else {
      (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
                (FontSize,this->m_pTextRender,str,0xffffffffffffffff);
      in_XMM1_Db.w = 0.0;
      do {
        fVar13 = (extraout_XMM0_Da_01 - aVar14.z) - Textbox.w;
        if (Textbox.w / 3.0 <= fVar13) {
          fVar13 = Textbox.w / 3.0;
        }
        aVar14.z = aVar14.z + fVar13;
        in_XMM1_Da.z = Textbox.w;
      } while (Textbox.w < extraout_XMM0_Da_00 - aVar14.z);
    }
  }
  pLineInput->m_ScrollOffset = (float)aVar14;
  if ((pCVar3 == pLineInput) && (this->m_Enabled != false)) {
    CLineInput::Activate(pLineInput,UI);
  }
  else {
    CLineInput::Deactivate(pLineInput);
  }
  local_58._0_8_ =
       (*(code *)**(undefined8 **)pColorFunction)(pColorFunction,pCVar3 == pLineInput,bVar5);
  local_58.field_2 = in_XMM1_Da;
  local_58.field_3 = in_XMM1_Db;
  CUIRect::Draw(pRect,&local_58,5.0,Corners);
  ClipEnable(this,pRect);
  Textbox.x = Textbox.x - aVar14.z;
  (pLineInput->m_TextCursor).m_CursorPos.field_0.x = Textbox.x;
  (pLineInput->m_TextCursor).m_CursorPos.field_1.y = Textbox.h * 0.5 + Textbox.y;
  CLineInput::Render(pLineInput);
  ClipDisable(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool CUI::DoEditBox(CLineInput *pLineInput, const CUIRect *pRect, float FontSize, int Corners, const IButtonColorFunction *pColorFunction)
{
	CTextCursor *pCursor = pLineInput->GetCursor();
	pCursor->m_FontSize = FontSize;
	pCursor->m_Align = TEXTALIGN_ML;

	const bool Inside = MouseHovered(pRect);
	const bool Active = LastActiveItem() == pLineInput;
	const bool Changed = pLineInput->WasChanged();
	const char *pDisplayStr = pLineInput->GetDisplayedString();

	bool UpdateOffset = false;
	float ScrollOffset = pLineInput->GetScrollOffset();

	static bool s_DoScroll = false;
	static int s_SelectionStartOffset = -1;

	const float VSpacing = 2.0f;
	CUIRect Textbox;
	pRect->VMargin(VSpacing, &Textbox);

	if(Active)
	{
		static float s_ScrollStartX = 0.0f;

		int CursorOffset = pLineInput->GetCursorOffset();

		if(Inside && MouseButton(0) && !Changed)
		{
			s_DoScroll = true;
			s_ScrollStartX = MouseX();
			const float MxRel = MouseX() - Textbox.x;
			float PreviousWidth = 0.0f;
			for(int i = 1, Offset = 0; i <= pLineInput->GetNumChars(); i++)
			{
				int PrevOffset = Offset;
				Offset = str_utf8_forward(pDisplayStr, Offset);
				const float TextWidth = TextRender()->TextWidth(FontSize, pDisplayStr, Offset);
				if(PreviousWidth + (TextWidth - PreviousWidth)/2.0f - ScrollOffset > MxRel)
				{
					CursorOffset = PrevOffset;
					if(s_SelectionStartOffset < 0)
						s_SelectionStartOffset = CursorOffset;
					break;
				}
				PreviousWidth = TextWidth;

				if(i == pLineInput->GetNumChars())
				{
					CursorOffset = pLineInput->GetLength();
					if(s_SelectionStartOffset < 0)
						s_SelectionStartOffset = CursorOffset;
				}
			}
		}
		else if(!MouseButton(0) || Changed)
		{
			s_DoScroll = false;
			s_SelectionStartOffset = -1;
		}
		else if(s_DoScroll)
		{
			// do scrolling
			if(MouseX() < Textbox.x && s_ScrollStartX-MouseX() > 10.0f)
			{
				CursorOffset = str_utf8_rewind(pDisplayStr, CursorOffset);
				s_ScrollStartX = MouseX();
				UpdateOffset = true;
			}
			else if(MouseX() > Textbox.x+Textbox.w && MouseX()-s_ScrollStartX > 10.0f)
			{
				CursorOffset = str_utf8_forward(pDisplayStr, CursorOffset);
				s_ScrollStartX = MouseX();
				UpdateOffset = true;
			}
		}
		else if(!Inside && MouseButton(0))
		{
			s_DoScroll = false;
			s_SelectionStartOffset = -1;
			SetActiveItem(0);
			ClearLastActiveItem();
		}

		if(s_SelectionStartOffset >= 0)
		{
			pLineInput->SetCursorOffset(pLineInput->OffsetFromDisplayToActual(CursorOffset));
			pLineInput->SetSelection(pLineInput->OffsetFromDisplayToActual(s_SelectionStartOffset), pLineInput->OffsetFromDisplayToActual(CursorOffset));
		}
	}

	bool JustGotActive = false;

	if(CheckActiveItem(pLineInput))
	{
		if(!MouseButton(0))
		{
			s_DoScroll = false;
			s_SelectionStartOffset = -1;
			SetActiveItem(0);
		}
	}
	else if(HotItem() == pLineInput)
	{
		if(MouseButton(0))
		{
			if(!Active)
				JustGotActive = true;
			SetActiveItem(pLineInput);
		}
	}

	if(Inside)
		SetHotItem(pLineInput);

	// check if the text has to be moved
	if(Active && !JustGotActive && (UpdateOffset || Changed))
	{
		float w = TextRender()->TextWidth(FontSize, pDisplayStr, pLineInput->OffsetFromActualToDisplay(pLineInput->GetCursorOffset()));
		if(w-ScrollOffset > Textbox.w)
		{
			// move to the left
			float wt = TextRender()->TextWidth(FontSize, pDisplayStr, -1);
			do
			{
				ScrollOffset += minimum(wt-ScrollOffset-Textbox.w, Textbox.w/3);
			}
			while(w-ScrollOffset > Textbox.w);
		}
		else if(w-ScrollOffset < 0.0f)
		{
			// move to the right
			do
			{
				ScrollOffset = maximum(0.0f, ScrollOffset-Textbox.w/3);
			}
			while(w-ScrollOffset < 0.0f);
		}
	}

	pLineInput->SetScrollOffset(ScrollOffset);
	if(Enabled() && Active && !JustGotActive)
		pLineInput->Activate(UI);
	else
		pLineInput->Deactivate();

	// render
	pRect->Draw(pColorFunction->GetColor(Active, Inside), 5.0f, Corners);
	ClipEnable(pRect);
	Textbox.x -= ScrollOffset;
	pCursor->MoveTo(Textbox.x, Textbox.y + Textbox.h/2.0f);
	pLineInput->Render();
	ClipDisable();

	return Changed;
}